

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O1

ssize_t uv__fs_copy_file_range
                  (int fd_in,off_t *off_in,int fd_out,off_t *off_out,size_t len,uint flags)

{
  undefined8 in_RAX;
  long lVar1;
  
  lVar1 = syscall(0x146,fd_in,off_in,fd_out,off_out,len,CONCAT44((int)((ulong)in_RAX >> 0x20),flags)
                 );
  return lVar1;
}

Assistant:

ssize_t
uv__fs_copy_file_range(int fd_in,
                       off_t* off_in,
                       int fd_out,
                       off_t* off_out,
                       size_t len,
                       unsigned int flags)
{
#ifdef __NR_copy_file_range
  return syscall(__NR_copy_file_range,
                 fd_in,
                 off_in,
                 fd_out,
                 off_out,
                 len,
                 flags);
#else
  return errno = ENOSYS, -1;
#endif
}